

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

CFGNode * __thiscall
dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block
          (CFGStructurizer *this,CFGNode *header,CFGNode *merge,CFGNode *path)

{
  pointer ppCVar1;
  CFGNode *ladder;
  CFGStructurizer *this_00;
  CFGNode *true_block;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar3;
  pointer ppCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar5;
  CFGNode *p;
  UnorderedSet<const_CFGNode_*> normal_preds;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  CFGNode *local_c0;
  CFGStructurizer *local_b8;
  CFGNode *local_b0;
  String local_a8;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_88;
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  bVar2 = CFGNode::dominates(header,merge);
  if (bVar2) {
    bVar2 = CFGNode::dominates(header,path);
    if (bVar2) {
      if ((merge != path) &&
         (((this->reachability_bitset).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [(ulong)(this->reachability_stride * merge->forward_post_visit_order) +
            (ulong)(path->forward_post_visit_order >> 5)] >> (path->forward_post_visit_order & 0x1f)
          & 1) == 0)) {
        __assert_fail("query_reachability(*merge, *path)",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x150c,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      bVar2 = CFGNode::dominates(merge,path);
      if (bVar2) {
        __assert_fail("!merge->dominates(path)",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x150d,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      if (header != merge) {
        if (merge == path) {
          __assert_fail("merge != path",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x150f,
                        "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                       );
        }
        local_b0 = path;
        if (header != path) {
          local_b8 = this;
          local_c0 = create_ladder_block(this,header,merge,".transpose");
          local_68._M_buckets = &local_68._M_single_bucket;
          local_68._M_bucket_count = 1;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = 0;
          local_68._M_rehash_policy._M_max_load_factor = 1.0;
          local_68._M_rehash_policy._M_next_resize = 0;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          ppCVar4 = (local_c0->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppCVar1 = (local_c0->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppCVar4 != ppCVar1) {
            do {
              local_a8._M_dataplus._M_p = (pointer)*ppCVar4;
              local_e8._M_unused._M_object = &local_68;
              std::
              _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<dxil_spv::CFGNode_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
                        ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_68,&local_a8,&local_e8);
              ppCVar4 = ppCVar4 + 1;
            } while (ppCVar4 != ppCVar1);
          }
          true_block = local_b0;
          this_00 = local_b8;
          ladder = local_c0;
          traverse_dominated_blocks_and_rewrite_branch(local_b8,header,local_b0,local_c0);
          local_e8._8_8_ = 0;
          local_e8._M_unused._M_object = &local_68;
          pcStack_d0 = std::
                       _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5402:24)>
                       ::_M_invoke;
          local_d8 = std::
                     _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5402:24)>
                     ::_M_manager;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                      *)&local_88,"transpose_ladder_phi_","");
          pbVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                   ::_M_append(&local_88,(ladder->name)._M_dataplus._M_p,
                               (ladder->name)._M_string_length);
          local_a8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
          paVar5 = &pbVar3->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_a8._M_dataplus._M_p == paVar5) {
            local_a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          }
          else {
            local_a8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          }
          local_a8._M_string_length = pbVar3->_M_string_length;
          (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar3->_M_string_length = 0;
          (pbVar3->field_2)._M_local_buf[0] = '\0';
          rewrite_ladder_conditional_branch_from_incoming_blocks
                    (this_00,ladder,true_block,merge,
                     (function<bool_(const_dxil_spv::CFGNode_*)> *)&local_e8,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            free_in_thread(local_a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            free_in_thread(local_88._M_dataplus._M_p);
          }
          if (local_d8 != (code *)0x0) {
            (*local_d8)(&local_e8,&local_e8,__destroy_functor);
          }
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          return ladder;
        }
        __assert_fail("header != path",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x1510,
                      "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                     );
      }
      __assert_fail("header != merge",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x150e,
                    "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                   );
    }
  }
  __assert_fail("header->dominates(merge) && header->dominates(path)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x150b,
                "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
               );
}

Assistant:

CFGNode *CFGStructurizer::transpose_code_path_through_ladder_block(
    CFGNode *header, CFGNode *merge, CFGNode *path)
{
	assert(header->dominates(merge) && header->dominates(path));
	assert(query_reachability(*merge, *path));
	assert(!merge->dominates(path));
	assert(header != merge);
	assert(merge != path);
	assert(header != path);

	// Rewrite the merge block into merge.pred where merge.pred will branch to either merge or path.
	auto *ladder = create_ladder_block(header, merge, ".transpose");

	UnorderedSet<const CFGNode *> normal_preds;
	for (auto *p : ladder->pred)
		normal_preds.insert(p);
	traverse_dominated_blocks_and_rewrite_branch(header, path, ladder);
	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder, path, merge, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
		String("transpose_ladder_phi_") + ladder->name);
	return ladder;
}